

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsUndefinedObject(Var instance,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *this;
  JavascriptLibrary *pJVar4;
  undefined4 *puVar5;
  RecyclableObject *libraryUndefined;
  JavascriptLibrary *library_local;
  Var instance_local;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    this = RecyclableObject::GetScriptContext((RecyclableObject *)instance);
    pJVar4 = ScriptContext::GetLibrary(this);
    bVar2 = pJVar4 == library;
  }
  else {
    bVar2 = true;
  }
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2b4f,
                                "(!VarIs<RecyclableObject>(instance) ? 1 : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library)"
                                ,
                                "!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  libraryUndefined = JavascriptLibraryBase::GetUndefined(&library->super_JavascriptLibraryBase);
  BVar3 = IsUndefinedObject(instance,libraryUndefined);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::IsUndefinedObject(Var instance, JavascriptLibrary* library)
    {
        Assert(!VarIs<RecyclableObject>(instance) ? TRUE : ((RecyclableObject*)instance)->GetScriptContext()->GetLibrary() == library );
        return JavascriptOperators::IsUndefinedObject(instance, library->GetUndefined());
    }